

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          *handler)

{
  internal *end;
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  internal *piVar4;
  internal *piVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *this_00;
  wchar_t *pwVar6;
  value_type_conflict vVar7;
  char *message;
  internal *piVar8;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             *)format_str.size_;
  if (format_str.data_ == (wchar_t *)0x0) {
    return;
  }
  end = this + (long)format_str.data_ * 4;
  do {
    wVar1 = *(wchar_t *)this;
    piVar5 = this;
    while (wVar1 != L'{') {
      piVar5 = piVar5 + 4;
      piVar8 = this;
      if (piVar5 == end) goto LAB_001fbb8f;
      wVar1 = *(wchar_t *)piVar5;
    }
    piVar8 = this;
    if (this != piVar5) {
      do {
        while (piVar4 = piVar8, piVar8 = piVar4 + 4, *(wchar_t *)piVar4 == L'}') {
          if ((piVar8 == piVar5) || (*(int *)piVar8 != 0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
            goto LAB_001fba78;
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar8);
          this = piVar4 + 8;
          piVar8 = this;
          if (this == piVar5) {
            this = piVar4 + 8;
            goto LAB_001fba6d;
          }
        }
      } while (piVar8 != piVar5);
LAB_001fba6d:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
      ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar5);
    }
LAB_001fba78:
    piVar5 = piVar5 + 4;
    if (piVar5 == end) {
      message = "invalid format string";
      goto LAB_001fbbec;
    }
    if ((char)*(wchar_t *)piVar5 == '}') {
      basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
      ::next_arg((format_arg *)&local_58.string,&this_00->context);
      (this_00->arg).type_ = local_48;
      (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
      (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_001fbaa9:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
      ::on_replacement_field(this_00,(wchar_t *)piVar5);
    }
    else {
      if (*(wchar_t *)piVar5 != L'{') {
        local_58._0_8_ = this_00;
        piVar5 = (internal *)
                 parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar5,(wchar_t *)end,
                            (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_&,_wchar_t>
                             *)&local_58.string);
        if (piVar5 != end) {
          if (*(wchar_t *)piVar5 == L':') {
            piVar5 = (internal *)
                     format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                     ::on_format_specs(this_00,(wchar_t *)(piVar5 + 4),(wchar_t *)end);
            if ((piVar5 != end) && (*(wchar_t *)piVar5 == L'}')) goto LAB_001fbb4b;
            message = "unknown format specifier";
            goto LAB_001fbbec;
          }
          if (*(wchar_t *)piVar5 == L'}') goto LAB_001fbaa9;
        }
        message = "missing \'}\' in format string";
        goto LAB_001fbbec;
      }
      pwVar6 = (this_00->context).
               super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
               .out_.super_truncating_iterator_base<wchar_t_*>.out_;
      uVar2 = (this_00->context).
              super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
              .out_.super_truncating_iterator_base<wchar_t_*>.limit_;
      uVar3 = (this_00->context).
              super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
              .out_.super_truncating_iterator_base<wchar_t_*>.count_;
      vVar7 = 0x7b;
      if (uVar3 < uVar2) {
        vVar7 = (this_00->context).
                super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                .out_.blackhole_;
        *pwVar6 = L'{';
        pwVar6 = pwVar6 + 1;
      }
      (this_00->context).
      super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
      .out_.super_truncating_iterator_base<wchar_t_*>.out_ = pwVar6;
      (this_00->context).
      super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
      .out_.super_truncating_iterator_base<wchar_t_*>.limit_ = uVar2;
      (this_00->context).
      super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
      .out_.super_truncating_iterator_base<wchar_t_*>.count_ = uVar3 + 1;
      (this_00->context).
      super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
      .out_.blackhole_ = vVar7;
    }
LAB_001fbb4b:
    this = piVar5 + 4;
    if (this == end) {
      return;
    }
  } while( true );
LAB_001fbb8f:
  piVar5 = piVar8;
  piVar8 = piVar5 + 4;
  if (*(wchar_t *)piVar5 == L'}') {
    if ((piVar8 == end) || (*(int *)piVar8 != 0x7d)) {
      message = "unmatched \'}\' in format string";
LAB_001fbbec:
      error_handler::on_error((error_handler *)this_00,message);
      return;
    }
    format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)this,(wchar_t *)piVar8);
    this = piVar5 + 8;
    piVar8 = this;
    if (this == end) {
      this = piVar5 + 8;
      goto LAB_001fbbcb;
    }
    goto LAB_001fbb8f;
  }
  if (piVar8 == end) {
LAB_001fbbcb:
    format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
    ::on_text(this_00,(wchar_t *)this,(wchar_t *)end);
    return;
  }
  goto LAB_001fbb8f;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}